

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  future<unsigned_long> local_20;
  
  std::async<unsigned_long(&)(unsigned_long),unsigned_long_const&>
            ((launch)&local_20,(_func_unsigned_long_unsigned_long *)0x1,
             (unsigned_long *)anon_unknown.dwarf_a9c5::call_function);
  std::future<unsigned_long>::get(&local_20);
  if (local_20.super___basic_future<unsigned_long>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___basic_future<unsigned_long>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Factorial(20) => ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," == ",4);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," <= Should be",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of calls should be #",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int, char **)
{
  const auto result = std::async(std::launch::async, call_function, N).get();

  std::cout << "Factorial(20) => " << result << " == " << 2432902008176640000ull << " <= Should be" << std::endl;
  std::cout << "Number of calls should be #" << N << std::endl;

  return 0;
}